

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void setGetterMethod(Pager *pPager)

{
  code *pcVar1;
  
  if (pPager->errCode == 0) {
    if (pPager->bUseFetch == '\0') {
      pcVar1 = getPageNormal;
    }
    else {
      pcVar1 = getPageMMap;
    }
  }
  else {
    pcVar1 = getPageError;
  }
  pPager->xGet = pcVar1;
  return;
}

Assistant:

static void setGetterMethod(Pager *pPager){
  if( pPager->errCode ){
    pPager->xGet = getPageError;
#if SQLITE_MAX_MMAP_SIZE>0
  }else if( USEFETCH(pPager)
#ifdef SQLITE_HAS_CODEC
   && pPager->xCodec==0
#endif
  ){
    pPager->xGet = getPageMMap;
#endif /* SQLITE_MAX_MMAP_SIZE>0 */
  }else{
    pPager->xGet = getPageNormal;
  }
}